

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PipelineStateBase.hpp
# Opt level: O2

void __thiscall
Diligent::PipelineStateBase<Diligent::EngineVkImplTraits>::CopyResourceSignatures
          (PipelineStateBase<Diligent::EngineVkImplTraits> *this,PipelineStateCreateInfo *CreateInfo
          ,FixedLinearAllocator *MemPool)

{
  byte bVar1;
  PipelineResourceSignatureVkImpl *pPVar2;
  bool bVar3;
  uint uVar4;
  uint uVar5;
  SHADER_TYPE SVar6;
  RefCntAutoPtr<Diligent::PipelineResourceSignatureVkImpl> *pRVar7;
  PipelineResourceSignatureVkImpl *pObj;
  char (*in_RCX) [86];
  PipelineResourceSignatureDesc *Args;
  Uint32 StageIndex;
  ulong uVar8;
  undefined4 in_stack_ffffffffffffff78;
  uint uVar9;
  Char *local_80;
  uint local_74;
  string msg;
  char *local_38;
  
  pRVar7 = FixedLinearAllocator::
           ConstructArray<Diligent::RefCntAutoPtr<Diligent::PipelineResourceSignatureVkImpl>>
                     (MemPool,(ulong)this->m_SignatureCount);
  this->m_Signatures = pRVar7;
  if ((this->m_UsingImplicitSignature != true) ||
     (((byte *)CreateInfo->pInternalData != (byte *)0x0 && ((*CreateInfo->pInternalData & 1) != 0)))
     ) {
    if ((CreateInfo->ResourceSignaturesCount == 0) ||
       (CreateInfo->ppResourceSignatures == (IPipelineResourceSignature **)0x0)) {
      FormatString<char[26],char[86]>
                (&msg,(Diligent *)"Debug expression failed:\n",
                 (char (*) [26])
                 "CreateInfo.ResourceSignaturesCount != 0 && CreateInfo.ppResourceSignatures != nullptr"
                 ,in_RCX);
      in_RCX = (char (*) [86])0x4fb;
      DebugAssertionFailed
                (msg._M_dataplus._M_p,"CopyResourceSignatures",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/PipelineStateBase.hpp"
                 ,0x4fb);
      std::__cxx11::string::~string((string *)&msg);
    }
    for (uVar8 = 0; uVar8 < CreateInfo->ResourceSignaturesCount; uVar8 = uVar8 + 1) {
      pObj = ClassPtrCast<Diligent::PipelineResourceSignatureVkImpl,Diligent::IPipelineResourceSignature>
                       (CreateInfo->ppResourceSignatures[uVar8]);
      if (pObj == (PipelineResourceSignatureVkImpl *)0x0) {
        FormatString<char[26],char[22]>
                  (&msg,(Diligent *)"Debug expression failed:\n",(char (*) [26])0x5c1b52,
                   (char (*) [22])in_RCX);
        in_RCX = (char (*) [86])0x4ff;
        DebugAssertionFailed
                  (msg._M_dataplus._M_p,"CopyResourceSignatures",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/PipelineStateBase.hpp"
                   ,0x4ff);
        std::__cxx11::string::~string((string *)&msg);
      }
      bVar1 = (pObj->super_PipelineResourceSignatureBase<Diligent::EngineVkImplTraits>).
              super_DeviceObjectBase<Diligent::IPipelineResourceSignature,_Diligent::RenderDeviceVkImpl,_Diligent::PipelineResourceSignatureDesc>
              .m_Desc.BindingIndex;
      uVar4 = (uint)bVar1;
      if (this->m_SignatureCount <= bVar1) {
        FormatString<char[26],char[25]>
                  (&msg,(Diligent *)"Debug expression failed:\n",
                   (char (*) [26])"Index < m_SignatureCount",(char (*) [25])in_RCX);
        DebugAssertionFailed
                  (msg._M_dataplus._M_p,"CopyResourceSignatures",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/PipelineStateBase.hpp"
                   ,0x504);
        std::__cxx11::string::~string((string *)&msg);
      }
      Args = &(pObj->super_PipelineResourceSignatureBase<Diligent::EngineVkImplTraits>).
              super_DeviceObjectBase<Diligent::IPipelineResourceSignature,_Diligent::RenderDeviceVkImpl,_Diligent::PipelineResourceSignatureDesc>
              .m_Desc;
      pPVar2 = this->m_Signatures[uVar4].m_pObject;
      uVar9 = uVar4;
      if (pPVar2 != (PipelineResourceSignatureVkImpl *)0x0) {
        local_80 = (Char *)CONCAT44(local_80._4_4_,uVar4);
        FormatString<char[30],char_const*,char[12],unsigned_int,char[45],char_const*,char[100]>
                  (&msg,(Diligent *)"Pipeline resource signature \'",(char (*) [30])Args,
                   (char **)"\' at index ",(char (*) [12])&local_80,
                   (uint *)" conflicts with another resource signature \'",
                   (char (*) [45])
                   &(pPVar2->super_PipelineResourceSignatureBase<Diligent::EngineVkImplTraits>).
                    super_DeviceObjectBase<Diligent::IPipelineResourceSignature,_Diligent::RenderDeviceVkImpl,_Diligent::PipelineResourceSignatureDesc>
                    .m_Desc,(char **)
                            "\' that uses the same index. This error should\'ve been caught by ValidatePipelineResourceSignatures."
                   ,(char (*) [100])CONCAT44(uVar4,in_stack_ffffffffffffff78));
        DebugAssertionFailed
                  (msg._M_dataplus._M_p,"CopyResourceSignatures",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/PipelineStateBase.hpp"
                   ,0x509);
        std::__cxx11::string::~string((string *)&msg);
      }
      SVar6 = (pObj->super_PipelineResourceSignatureBase<Diligent::EngineVkImplTraits>).
              m_ShaderStages;
      uVar5 = SVar6 - (SVar6 >> 1 & 0x55555555);
      uVar5 = (uVar5 >> 2 & 0x33333333) + (uVar5 & 0x33333333);
      uVar5 = (uVar5 >> 4) + uVar5 & 0xf0f0f0f;
      in_RCX = (char (*) [86])(ulong)uVar5;
      for (StageIndex = 0; uVar5 * 0x1010101 >> 0x18 != StageIndex; StageIndex = StageIndex + 1) {
        SVar6 = PipelineResourceSignatureBase<Diligent::EngineVkImplTraits>::
                GetActiveShaderStageType
                          (&pObj->super_PipelineResourceSignatureBase<Diligent::EngineVkImplTraits>,
                           StageIndex);
        bVar3 = IsConsistentShaderType(SVar6,(CreateInfo->PSODesc).PipelineType);
        if (!bVar3) {
          local_74 = uVar9;
          local_80 = GetShaderTypeLiteralName(SVar6);
          local_38 = GetPipelineTypeString((CreateInfo->PSODesc).PipelineType);
          FormatString<char[30],char_const*,char[12],unsigned_int,char[20],char_const*,char[46],char_const*,char[3]>
                    (&msg,(Diligent *)"Pipeline resource signature \'",(char (*) [30])Args,
                     (char **)"\' at index ",(char (*) [12])&local_74,(uint *)" has shader stage \'"
                     ,(char (*) [20])&local_80,
                     (char **)"\' that is not compatible with pipeline type \'",
                     (char (*) [46])&local_38,(char **)"\'.",
                     (char (*) [3])CONCAT44(uVar9,in_stack_ffffffffffffff78));
          in_RCX = (char (*) [86])0x511;
          DebugAssertionFailed
                    (msg._M_dataplus._M_p,"CopyResourceSignatures",
                     "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/PipelineStateBase.hpp"
                     ,0x511);
          std::__cxx11::string::~string((string *)&msg);
        }
      }
      RefCntAutoPtr<Diligent::PipelineResourceSignatureVkImpl>::operator=
                ((RefCntAutoPtr<Diligent::PipelineResourceSignatureVkImpl> *)
                 ((long)&this->m_Signatures->m_pObject + (ulong)(uVar4 << 3)),pObj);
    }
  }
  return;
}

Assistant:

void CopyResourceSignatures(const PipelineStateCreateInfo& CreateInfo, FixedLinearAllocator& MemPool)
    {
        m_Signatures = MemPool.ConstructArray<SignatureAutoPtrType>(m_SignatureCount);
        if (!m_UsingImplicitSignature || (GetInternalCreateFlags(CreateInfo) & PSO_CREATE_INTERNAL_FLAG_IMPLICIT_SIGNATURE0) != 0)
        {
            VERIFY_EXPR(CreateInfo.ResourceSignaturesCount != 0 && CreateInfo.ppResourceSignatures != nullptr);
            for (Uint32 i = 0; i < CreateInfo.ResourceSignaturesCount; ++i)
            {
                PipelineResourceSignatureImplType* pSignature = ClassPtrCast<PipelineResourceSignatureImplType>(CreateInfo.ppResourceSignatures[i]);
                VERIFY_EXPR(pSignature != nullptr);

                const Uint32 Index = pSignature->GetDesc().BindingIndex;

#ifdef DILIGENT_DEBUG
                VERIFY_EXPR(Index < m_SignatureCount);

                VERIFY(m_Signatures[Index] == nullptr,
                       "Pipeline resource signature '", pSignature->GetDesc().Name, "' at index ", Uint32{Index},
                       " conflicts with another resource signature '", m_Signatures[Index]->GetDesc().Name,
                       "' that uses the same index. This error should've been caught by ValidatePipelineResourceSignatures.");

                for (Uint32 s = 0, StageCount = pSignature->GetNumActiveShaderStages(); s < StageCount; ++s)
                {
                    const SHADER_TYPE ShaderType = pSignature->GetActiveShaderStageType(s);
                    VERIFY(IsConsistentShaderType(ShaderType, CreateInfo.PSODesc.PipelineType),
                           "Pipeline resource signature '", pSignature->GetDesc().Name, "' at index ", Uint32{Index},
                           " has shader stage '", GetShaderTypeLiteralName(ShaderType), "' that is not compatible with pipeline type '",
                           GetPipelineTypeString(CreateInfo.PSODesc.PipelineType), "'.");
                }
#endif

                m_Signatures[Index] = pSignature;
            }
        }
    }